

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::
GenerateSerializeWithCachedSizesToArray(RepeatedStringFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Formatter format;
  FieldDescriptor *local_60;
  _func_void_FieldDescriptor_ptr *local_58;
  Formatter local_50;
  
  local_50.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_50.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  Formatter::operator()<>
            (&local_50,
             "for (int i = 0, n = this->_internal_$name$_size(); i < n; i++) {\n  const auto& s = this->_internal_$name$(i);\n"
            );
  io::Printer::Indent(local_50.printer_);
  pFVar1 = (this->super_FieldGenerator).descriptor_;
  if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
    local_58 = FieldDescriptor::TypeOnceInit;
    local_60 = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x18),&local_58,&local_60);
  }
  if (pFVar1[2] == (FieldDescriptor)0x9) {
    GenerateUtf8CheckCodeForString
              ((this->super_FieldGenerator).descriptor_,(this->super_FieldGenerator).options_,false,
               "s.data(), static_cast<int>(s.length()),\n",&local_50);
  }
  io::Printer::Outdent(local_50.printer_);
  Formatter::operator()<>
            (&local_50,"  target = stream->Write$declared_type$($number$, s, target);\n}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50.vars_._M_t);
  return;
}

Assistant:

void RepeatedStringFieldGenerator::GenerateSerializeWithCachedSizesToArray(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "for (int i = 0, n = this->_internal_$name$_size(); i < n; i++) {\n"
      "  const auto& s = this->_internal_$name$(i);\n");
  // format("for (const std::string& s : this->$name$()) {\n");
  format.Indent();
  if (descriptor_->type() == FieldDescriptor::TYPE_STRING) {
    GenerateUtf8CheckCodeForString(descriptor_, options_, false,
                                   "s.data(), static_cast<int>(s.length()),\n",
                                   format);
  }
  format.Outdent();
  format(
      "  target = stream->Write$declared_type$($number$, s, target);\n"
      "}\n");
}